

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-emit.c
# Opt level: O1

void fy_emit_sequence_item_prolog(fy_emitter *emit,fy_emit_save_ctx *sc,fy_token *fyt_value)

{
  fy_emitter_cfg_flags fVar1;
  int indent;
  int extraout_EDX;
  fy_emitter_cfg_flags fVar2;
  int extraout_EDX_00;
  int flags;
  fy_token *extraout_RDX;
  fy_token *pfVar3;
  
  *(byte *)&sc->flags = (byte)sc->flags | 2;
  fVar1 = emit->cfg->flags & 0xf00000;
  pfVar3 = fyt_value;
  if ((fVar1 != FYECF_MODE_FLOW_ONELINE) && (fVar1 != FYECF_MODE_JSON_ONELINE)) {
    fy_emit_write_indent(emit,sc->indent);
    pfVar3 = extraout_RDX;
  }
  flags = (int)pfVar3;
  if (((undefined1  [40])((undefined1  [40])*sc & (undefined1  [40])0x2) == (undefined1  [40])0x0)
     && (fVar1 = emit->cfg->flags,
        (fVar1 & 0xf00000) != FYECF_MODE_JSON_ONELINE && (fVar1 & 0xe00000) != FYECF_MODE_JSON)) {
    fy_emit_write_indicator(emit,di_dash,sc->flags,sc->indent,fyewt_indicator);
    flags = extraout_EDX;
  }
  if ((fyt_value != (fy_token *)0x0) && (fyt_value->comment[0].fyi != (fy_input *)0x0)) {
    indent = sc->indent;
    if (((undefined1  [40])((undefined1  [40])*sc & (undefined1  [40])0x2) == (undefined1  [40])0x0)
       && (fVar1 = emit->cfg->flags, fVar2 = fVar1 & 0xe00000,
          flags = CONCAT31((int3)(fVar2 >> 8),fVar2 == FYECF_MODE_JSON),
          (fVar1 & 0xf00000) != FYECF_MODE_JSON_ONELINE && fVar2 != FYECF_MODE_JSON)) {
      indent = fy_emit_increase_indent(emit,sc->flags,indent);
      flags = extraout_EDX_00;
    }
    fy_emit_token_comment(emit,fyt_value,flags,indent,fycp_top);
    return;
  }
  return;
}

Assistant:

static void fy_emit_sequence_item_prolog(struct fy_emitter *emit, struct fy_emit_save_ctx *sc,
                                         struct fy_token *fyt_value) {
    int tmp_indent;

    sc->flags |= DDNF_SEQ;

    if (!fy_emit_is_oneline(emit))
        fy_emit_write_indent(emit, sc->indent);

    if (!sc->flow && !fy_emit_is_json_mode(emit))
        fy_emit_write_indicator(emit, di_dash, sc->flags, sc->indent, fyewt_indicator);

    tmp_indent = sc->indent;
    if (fy_emit_token_has_comment(emit, fyt_value, fycp_top)) {
        if (!sc->flow && !fy_emit_is_json_mode(emit))
            tmp_indent = fy_emit_increase_indent(emit, sc->flags, sc->indent);
        fy_emit_token_comment(emit, fyt_value, sc->flags, tmp_indent, fycp_top);
    }
}